

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O1

int Extra_bddSuppDifferentVars(DdManager *dd,DdNode *S1,DdNode *S2,int DiffMax)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  DdHalfWord DVar4;
  bool bVar5;
  
  uVar2 = S1->index;
  iVar3 = 0;
  bVar5 = uVar2 == 0x7fffffff;
  if (bVar5) {
LAB_00803687:
    S1 = S2;
    if (S2->index == 0x7fffffff) goto LAB_00803699;
  }
  else {
    iVar1 = 1;
    if (1 < DiffMax) {
      iVar1 = DiffMax;
    }
    DVar4 = S2->index;
    iVar3 = 0;
    if (DVar4 != 0x7fffffff) {
      iVar3 = 0;
      do {
        if (uVar2 == DVar4) {
          S1 = (S1->type).kids.T;
          S2 = (S2->type).kids.T;
        }
        else {
          if (iVar3 == iVar1 + -1) {
            return DiffMax;
          }
          if (dd->perm[uVar2] < dd->perm[DVar4]) {
            S1 = (S1->type).kids.T;
          }
          else {
            S2 = (S2->type).kids.T;
          }
          iVar3 = iVar3 + 1;
        }
        uVar2 = S1->index;
        bVar5 = uVar2 == 0x7fffffff;
        if (bVar5) goto LAB_00803687;
        DVar4 = S2->index;
      } while (DVar4 != 0x7fffffff);
    }
    if (bVar5) goto LAB_00803687;
  }
  iVar1 = Extra_bddSuppSize(dd,S1);
  iVar3 = iVar3 + iVar1;
LAB_00803699:
  if (iVar3 < DiffMax) {
    DiffMax = iVar3;
  }
  return DiffMax;
}

Assistant:

int Extra_bddSuppDifferentVars( DdManager * dd, DdNode * S1, DdNode * S2, int DiffMax )
{
    int Result = 0;
    while ( S1->index != CUDD_CONST_INDEX && S2->index != CUDD_CONST_INDEX )
    {
        // if the top vars are the same, this var is the same
        if ( S1->index == S2->index )
        {
            S1 = cuddT(S1);
            S2 = cuddT(S2);
            continue;
        }
        // the top var is different
        Result++;

        if ( Result >= DiffMax )
            return DiffMax;

        // if the top vars are different, skip the one, which is higher
        if ( dd->perm[S1->index] < dd->perm[S2->index] )
            S1 = cuddT(S1);
        else
            S2 = cuddT(S2);
    }

    // consider the remaining variables
    if ( S1->index != CUDD_CONST_INDEX )
        Result += Extra_bddSuppSize(dd,S1);
    else if ( S2->index != CUDD_CONST_INDEX )
        Result += Extra_bddSuppSize(dd,S2);

    if ( Result >= DiffMax )
        return DiffMax;
    return Result;
}